

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_containers.hpp
# Opt level: O2

SPIRCombinedImageSampler * __thiscall
spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::
allocate<unsigned_int&,unsigned_int&,unsigned_int&>
          (ObjectPool<spirv_cross::SPIRCombinedImageSampler> *this,uint *p,uint *p_1,uint *p_2)

{
  Vector<spirv_cross::SPIRCombinedImageSampler_*> *this_00;
  uint uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRCombinedImageSampler *pSVar4;
  size_t sVar5;
  ulong uVar6;
  bool bVar7;
  SPIRCombinedImageSampler *ptr;
  SPIRCombinedImageSampler *local_40;
  SPIRCombinedImageSampler *local_38;
  
  this_00 = &this->vacants;
  sVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
  if (sVar5 == 0) {
    uVar6 = (ulong)(this->start_object_count <<
                   ((byte)(this->memory).
                          super_VectorView<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,_spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>_>
                          .buffer_size & 0x1f));
    pSVar4 = (SPIRCombinedImageSampler *)malloc(uVar6 * 0x18);
    if (pSVar4 == (SPIRCombinedImageSampler *)0x0) {
      return (SPIRCombinedImageSampler *)0x0;
    }
    local_38 = pSVar4;
    while (bVar7 = uVar6 != 0, uVar6 = uVar6 - 1, bVar7) {
      local_40 = pSVar4;
      SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::push_back(this_00,&local_40);
      pSVar4 = pSVar4 + 1;
    }
    SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
    ::emplace_back<spirv_cross::SPIRCombinedImageSampler*&>
              ((SmallVector<std::unique_ptr<spirv_cross::SPIRCombinedImageSampler,spirv_cross::ObjectPool<spirv_cross::SPIRCombinedImageSampler>::MallocDeleter>,8ul>
                *)&this->memory,&local_38);
    sVar5 = (this->vacants).super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>.buffer_size;
  }
  pSVar4 = (this_00->super_VectorView<spirv_cross::SPIRCombinedImageSampler_*>).ptr[sVar5 - 1];
  SmallVector<spirv_cross::SPIRCombinedImageSampler_*,_0UL>::pop_back(this_00);
  uVar1 = *p;
  uVar2 = *p_1;
  uVar3 = *p_2;
  (pSVar4->super_IVariant).self.id = 0;
  (pSVar4->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__IVariant_003a67a8;
  *(uint *)&(pSVar4->super_IVariant).field_0xc = uVar1;
  (pSVar4->image).id = uVar2;
  (pSVar4->sampler).id = uVar3;
  return pSVar4;
}

Assistant:

T *allocate(P &&... p)
	{
		if (vacants.empty())
		{
			unsigned num_objects = start_object_count << memory.size();
			T *ptr = static_cast<T *>(malloc(num_objects * sizeof(T)));
			if (!ptr)
				return nullptr;

			for (unsigned i = 0; i < num_objects; i++)
				vacants.push_back(&ptr[i]);

			memory.emplace_back(ptr);
		}

		T *ptr = vacants.back();
		vacants.pop_back();
		new (ptr) T(std::forward<P>(p)...);
		return ptr;
	}